

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Light_Button.cxx
# Opt level: O2

void __thiscall Fl_Light_Button::draw(Fl_Light_Button *this)

{
  byte bVar1;
  _func_int *p_Var2;
  int iVar3;
  Fl_Color FVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  _func_int **pp_Var8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint H;
  Fl_Boxtype t;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  
  bVar1 = (this->super_Fl_Button).super_Fl_Widget.box_;
  if (bVar1 != 0) {
    Fl_Widget::draw_box((Fl_Widget *)this,
                        (uint)((bVar1 != 1 && Fl::pushed_ == (Fl_Widget *)this) | bVar1),
                        (this->super_Fl_Button).super_Fl_Widget.color_);
  }
  if ((this->super_Fl_Button).value_ == '\0') {
    FVar4 = (this->super_Fl_Button).super_Fl_Widget.color_;
  }
  else {
    iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
    FVar4 = (this->super_Fl_Button).super_Fl_Widget.color2_;
    if (iVar3 == 0) {
      FVar4 = fl_inactive(FVar4);
    }
  }
  H = (this->super_Fl_Button).super_Fl_Widget.label_.size;
  iVar5 = Fl::box_dx((uint)(this->super_Fl_Button).super_Fl_Widget.box_);
  iVar16 = iVar5 + 2;
  iVar3 = (this->super_Fl_Button).super_Fl_Widget.h_;
  iVar9 = (int)(iVar3 - H) / 2;
  bVar1 = (this->super_Fl_Button).down_box_;
  t = (Fl_Boxtype)bVar1;
  if (0x1f < bVar1) {
LAB_001bacdb:
    iVar16 = iVar16 + (this->super_Fl_Button).super_Fl_Widget.x_;
    iVar9 = (this->super_Fl_Button).super_Fl_Widget.y_ + iVar9;
    uVar10 = H;
LAB_001bae2b:
    Fl_Widget::draw_box((Fl_Widget *)this,t,iVar16,iVar9,uVar10,H,FVar4);
    H = uVar10;
    goto LAB_001bae30;
  }
  if ((0xc000000cU >> (bVar1 & 0x1f) & 1) != 0) {
    Fl_Widget::draw_box((Fl_Widget *)this,t,iVar16 + (this->super_Fl_Button).super_Fl_Widget.x_,
                        (this->super_Fl_Button).super_Fl_Widget.y_ + iVar9,H,H,7);
    if ((this->super_Fl_Button).value_ != '\0') {
      iVar3 = Fl::is_scheme("gtk+");
      uVar12 = 0xf;
      if (iVar3 == 0) {
        uVar12 = (ulong)FVar4;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar12);
      iVar3 = (this->super_Fl_Button).super_Fl_Widget.x_;
      iVar16 = (this->super_Fl_Button).super_Fl_Widget.y_;
      iVar13 = iVar5 + iVar3;
      iVar11 = 3;
      iVar6 = (int)(H - 6) / 3;
      iVar7 = (int)(((H - 6) - iVar6) + H) / 2;
      uVar17 = (iVar16 + (iVar9 - iVar6) + iVar7) - 2;
      uVar18 = iVar6 + iVar13 + 5;
      iVar16 = iVar16 + iVar9;
      uVar15 = ((iVar6 + iVar16 + iVar7) - H) + 5;
      uVar10 = (iVar7 + iVar16) - 2;
      while (bVar19 = iVar11 != 0, iVar11 = iVar11 + -1, bVar19) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                  (fl_graphics_driver,iVar5 + 5 + iVar3,(ulong)uVar17,(ulong)uVar18,(ulong)uVar10);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                  (fl_graphics_driver,(ulong)uVar18,(ulong)uVar10,(ulong)((H + iVar13) - 2),
                   (ulong)uVar15);
        uVar17 = uVar17 + 1;
        uVar15 = uVar15 + 1;
        uVar10 = uVar10 + 1;
      }
    }
    goto LAB_001bae30;
  }
  if ((0xc00000U >> (t & _FL_PLASTIC_DOWN_BOX) & 1) == 0) {
    if (t != FL_NO_BOX) goto LAB_001bacdb;
    iVar11 = (this->super_Fl_Button).super_Fl_Widget.w_;
    uVar10 = (int)H / 2 + 1;
    if (iVar11 < (int)H / 2 + iVar16 * 2 + 1) {
      iVar16 = (int)(iVar11 - uVar10) / 2;
    }
    H = (iVar3 + iVar9 * -2) - 2;
    iVar3 = Fl::is_scheme("plastic");
    if (iVar3 != 0) {
      iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
      FVar4 = (this->super_Fl_Button).super_Fl_Widget.color2_;
      if (iVar3 == 0) {
        FVar4 = fl_inactive(FVar4);
      }
      if ((this->super_Fl_Button).value_ == '\0') {
        FVar4 = fl_color_average(FVar4,0x38,0.5);
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                (0,0x4076800000000000,fl_graphics_driver,
                 (ulong)(uint)(iVar16 + (this->super_Fl_Button).super_Fl_Widget.x_),
                 (ulong)(iVar9 + (this->super_Fl_Button).super_Fl_Widget.y_ + 1),(ulong)uVar10,
                 (ulong)H);
      H = uVar10;
      goto LAB_001bae30;
    }
    iVar16 = iVar16 + (this->super_Fl_Button).super_Fl_Widget.x_;
    iVar9 = iVar9 + (this->super_Fl_Button).super_Fl_Widget.y_ + 1;
    t = FL_THIN_DOWN_BOX;
    goto LAB_001bae2b;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,t,(this->super_Fl_Button).super_Fl_Widget.x_ + iVar16,
                      (this->super_Fl_Button).super_Fl_Widget.y_ + iVar9,H,H,7);
  if ((this->super_Fl_Button).value_ == '\0') goto LAB_001bae30;
  iVar3 = Fl::box_dw((uint)(this->super_Fl_Button).down_box_);
  iVar3 = (int)(H - iVar3) / 2;
  uVar15 = iVar3 + 1;
  uVar10 = iVar3 + 2;
  if ((H - uVar15 & 1) == 0) {
    uVar10 = uVar15;
  }
  iVar3 = (int)(H - uVar10) / 2;
  iVar16 = iVar16 + iVar3;
  iVar9 = iVar9 + iVar3;
  iVar3 = Fl::is_scheme("gtk+");
  p_Var2 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11];
  if (iVar3 == 0) {
    (*p_Var2)(fl_graphics_driver,(ulong)FVar4);
  }
  else {
    (*p_Var2)(fl_graphics_driver,0xf);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              (0,0x4076800000000000,fl_graphics_driver,
               (ulong)(((this->super_Fl_Button).super_Fl_Widget.x_ + iVar16) - 1),
               (ulong)((iVar9 + (this->super_Fl_Button).super_Fl_Widget.y_) - 1),(ulong)(uVar10 + 2)
               ,(ulong)(uVar10 + 2));
    FVar4 = fl_color_average(0xff,0xf,0.2);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar4);
    uVar10 = uVar10 - 1;
  }
  uVar12 = (ulong)uVar10;
  if (uVar10 - 3 < 3) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)((this->super_Fl_Button).super_Fl_Widget.x_ + iVar16 + 1),
               (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.y_ + iVar9),(ulong)(uVar10 - 2)
               ,uVar12);
    iVar3 = (this->super_Fl_Button).super_Fl_Widget.x_;
    uVar15 = iVar9 + (this->super_Fl_Button).super_Fl_Widget.y_ + 1;
    pp_Var8 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    uVar14 = (ulong)(uVar10 - 2);
LAB_001bad8b:
    (*pp_Var8[4])(fl_graphics_driver,(ulong)(uint)(iVar3 + iVar16),(ulong)uVar15,uVar12,uVar14);
  }
  else {
    if (uVar10 - 1 < 2) {
      iVar3 = (this->super_Fl_Button).super_Fl_Widget.x_;
      uVar15 = (this->super_Fl_Button).super_Fl_Widget.y_ + iVar9;
      pp_Var8 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
      uVar14 = uVar12;
      goto LAB_001bad8b;
    }
    if (uVar10 == 6) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)((this->super_Fl_Button).super_Fl_Widget.x_ + iVar16 + 2)
                 ,(ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.y_ + iVar9),2,6);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)((this->super_Fl_Button).super_Fl_Widget.x_ + iVar16 + 1)
                 ,(ulong)(uint)(iVar9 + 1 + (this->super_Fl_Button).super_Fl_Widget.y_),4,4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,
                 (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.x_ + iVar16),
                 (ulong)(iVar9 + (this->super_Fl_Button).super_Fl_Widget.y_ + 2),6,2);
    }
    else {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                (0,0x4076800000000000,fl_graphics_driver,
                 (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.x_ + iVar16),
                 (ulong)(uint)((this->super_Fl_Button).super_Fl_Widget.y_ + iVar9),uVar12,uVar12);
    }
  }
  iVar3 = Fl::is_scheme("gtk+");
  if (iVar3 != 0) {
    FVar4 = fl_color_average(0xff,0xf,0.5);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar4);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
              (0x404e000000000000,0x4066800000000000,fl_graphics_driver,
               (ulong)(uint)(iVar16 + (this->super_Fl_Button).super_Fl_Widget.x_),
               (ulong)(uint)(iVar9 + (this->super_Fl_Button).super_Fl_Widget.y_),(ulong)(uVar10 + 1)
               ,(ulong)(uVar10 + 1));
  }
LAB_001bae30:
  Fl_Widget::draw_label
            ((Fl_Widget *)this,iVar5 + H + 4 + (this->super_Fl_Button).super_Fl_Widget.x_,
             (this->super_Fl_Button).super_Fl_Widget.y_,
             (this->super_Fl_Button).super_Fl_Widget.w_ - (iVar5 * 2 + H + 4),
             (this->super_Fl_Button).super_Fl_Widget.h_);
  if (Fl::focus_ == (Fl_Widget *)this) {
    Fl_Widget::draw_focus((Fl_Widget *)this);
    return;
  }
  return;
}

Assistant:

void Fl_Light_Button::draw() {
  if (box()) draw_box(this==Fl::pushed() ? fl_down(box()) : box(), color());
  Fl_Color col = value() ? (active_r() ? selection_color() :
                            fl_inactive(selection_color())) : color();

  int W  = labelsize();
  int bx = Fl::box_dx(box());	// box frame width
  int dx = bx + 2;		// relative position of check mark etc.
  int dy = (h() - W) / 2;	// neg. offset o.k. for vertical centering
  int lx = 0;			// relative label position (STR #3237)

  if (down_box()) {
    // draw other down_box() styles:
    switch (down_box()) {
      case FL_DOWN_BOX :
      case FL_UP_BOX :
      case _FL_PLASTIC_DOWN_BOX :
      case _FL_PLASTIC_UP_BOX :
        // Check box...
        draw_box(down_box(), x()+dx, y()+dy, W, W, FL_BACKGROUND2_COLOR);
	if (value()) {
	  if (Fl::is_scheme("gtk+")) {
	    fl_color(FL_SELECTION_COLOR);
	  } else {
	    fl_color(col);
	  }
	  int tx = x() + dx + 3;
	  int tw = W - 6;
	  int d1 = tw/3;
	  int d2 = tw-d1;
	  int ty = y() + dy + (W+d2)/2-d1-2;
	  for (int n = 0; n < 3; n++, ty++) {
	    fl_line(tx, ty, tx+d1, ty+d1);
	    fl_line(tx+d1, ty+d1, tx+tw-1, ty+d1-d2+1);
	  }
	}
        break;
      case _FL_ROUND_DOWN_BOX :
      case _FL_ROUND_UP_BOX :
        // Radio button...
        draw_box(down_box(), x()+dx, y()+dy, W, W, FL_BACKGROUND2_COLOR);
	if (value()) {
	  int tW = (W - Fl::box_dw(down_box())) / 2 + 1;
	  if ((W - tW) & 1) tW++; // Make sure difference is even to center
	  int tdx = dx + (W - tW) / 2;
	  int tdy = dy + (W - tW) / 2;

	  if (Fl::is_scheme("gtk+")) {
	    fl_color(FL_SELECTION_COLOR);
	    tW --;
	    fl_pie(x() + tdx - 1, y() + tdy - 1, tW + 3, tW + 3, 0.0, 360.0);
	    fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.2f));
	  } else fl_color(col);

	  switch (tW) {
	    // Larger circles draw fine...
	    default :
              fl_pie(x() + tdx, y() + tdy, tW, tW, 0.0, 360.0);
	      break;

            // Small circles don't draw well on many systems...
	    case 6 :
	      fl_rectf(x() + tdx + 2, y() + tdy, tW - 4, tW);
	      fl_rectf(x() + tdx + 1, y() + tdy + 1, tW - 2, tW - 2);
	      fl_rectf(x() + tdx, y() + tdy + 2, tW, tW - 4);
	      break;

	    case 5 :
	    case 4 :
	    case 3 :
	      fl_rectf(x() + tdx + 1, y() + tdy, tW - 2, tW);
	      fl_rectf(x() + tdx, y() + tdy + 1, tW, tW - 2);
	      break;

	    case 2 :
	    case 1 :
	      fl_rectf(x() + tdx, y() + tdy, tW, tW);
	      break;
	  }

	  if (Fl::is_scheme("gtk+")) {
	    fl_color(fl_color_average(FL_WHITE, FL_SELECTION_COLOR, 0.5));
	    fl_arc(x() + tdx, y() + tdy, tW + 1, tW + 1, 60.0, 180.0);
	  }
	}
        break;
      default :
        draw_box(down_box(), x()+dx, y()+dy, W, W, col);
        break;
    }
    lx = dx + W + 2;
  } else {
    // if down_box() is zero, draw light button style:
    int hh = h()-2*dy - 2;
    int ww = W/2+1;
    int xx = dx;
    if (w()<ww+2*xx) xx = (w()-ww)/2;
    if (Fl::is_scheme("plastic")) {
      col = active_r() ? selection_color() : fl_inactive(selection_color());
      fl_color(value() ? col : fl_color_average(col, FL_BLACK, 0.5f));
      fl_pie(x()+xx, y()+dy+1, ww, hh, 0, 360);
    } else {
      draw_box(FL_THIN_DOWN_BOX, x()+xx, y()+dy+1, ww, hh, col);
    }
    lx = dx + ww + 2;
  }
  draw_label(x()+lx, y(), w()-lx-bx, h());
  if (Fl::focus() == this) draw_focus();
}